

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::timeRequest
          (TimeCoordinator *this,Time nextTime,IterationRequest iterate,Time newValueTime,
          Time newMessageTime)

{
  int32_t *piVar1;
  long lVar2;
  Time TVar3;
  baseType bVar4;
  byte bVar5;
  
  this->iterating = iterate;
  if (iterate == NO_ITERATIONS) {
    TVar3 = getNextPossibleTime(this);
    (this->time_next).internalTimeCode = TVar3.internalTimeCode;
    if (nextTime.internalTimeCode < TVar3.internalTimeCode) {
      nextTime = TVar3;
    }
    bVar5 = (this->info).uninterruptible;
    if ((bool)bVar5 == true) {
      TVar3 = generateAllowedTime(this,nextTime);
      (this->time_next).internalTimeCode = TVar3.internalTimeCode;
    }
    (this->time_requested).internalTimeCode = nextTime.internalTimeCode;
    if (newValueTime.internalTimeCode < TVar3.internalTimeCode) {
      newValueTime.internalTimeCode = TVar3.internalTimeCode;
    }
    (this->time_value).internalTimeCode = newValueTime.internalTimeCode;
    if (newMessageTime.internalTimeCode < TVar3.internalTimeCode) {
      newMessageTime.internalTimeCode = TVar3.internalTimeCode;
    }
    (this->time_message).internalTimeCode = newMessageTime.internalTimeCode;
  }
  else {
    lVar2 = (this->time_granted).internalTimeCode;
    if (nextTime.internalTimeCode < lVar2) {
      nextTime.internalTimeCode = lVar2;
    }
    if (iterate == FORCE_ITERATION) {
      nextTime.internalTimeCode = lVar2;
    }
    (this->time_requested).internalTimeCode = nextTime.internalTimeCode;
    if (newValueTime.internalTimeCode < lVar2) {
      newValueTime.internalTimeCode = lVar2;
    }
    (this->time_value).internalTimeCode = newValueTime.internalTimeCode;
    if (newMessageTime.internalTimeCode < lVar2) {
      newMessageTime.internalTimeCode = lVar2;
    }
    (this->time_message).internalTimeCode = newMessageTime.internalTimeCode;
    bVar5 = (this->info).uninterruptible;
  }
  if (newMessageTime.internalTimeCode < newValueTime.internalTimeCode) {
    newValueTime.internalTimeCode = newMessageTime.internalTimeCode;
  }
  if (nextTime.internalTimeCode < newValueTime.internalTimeCode) {
    newValueTime.internalTimeCode = nextTime.internalTimeCode;
  }
  TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
  bVar4 = newValueTime.internalTimeCode;
  if (TVar3.internalTimeCode < newValueTime.internalTimeCode) {
    bVar4 = nextTime.internalTimeCode;
  }
  if (iterate == NO_ITERATIONS) {
    bVar4 = nextTime.internalTimeCode;
  }
  if ((bVar5 & 1) == 0) {
    bVar4 = newValueTime.internalTimeCode;
  }
  (this->time_exec).internalTimeCode = bVar4;
  TimeDependencies::resetDependentEvents(&(this->super_BaseTimeCoordinator).dependencies,TVar3);
  piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
  *piVar1 = *piVar1 + 1;
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])(this);
  if ((this->super_BaseTimeCoordinator).dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_BaseTimeCoordinator).dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    sendTimeRequest(this,(GlobalFederateId)0x8831d580);
    return;
  }
  return;
}

Assistant:

void TimeCoordinator::timeRequest(Time nextTime,
                                  IterationRequest iterate,
                                  Time newValueTime,
                                  Time newMessageTime)
{
    iterating = iterate;

    if (iterating != IterationRequest::NO_ITERATIONS) {
        if (nextTime < time_granted || iterating == IterationRequest::FORCE_ITERATION) {
            nextTime = time_granted;
        }
    } else {
        time_next = getNextPossibleTime();
        if (nextTime < time_next) {
            nextTime = time_next;
        }
        if (info.uninterruptible) {
            time_next = generateAllowedTime(nextTime);
        }
    }
    time_requested = nextTime;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        time_value = (newValueTime > time_granted) ? newValueTime : time_granted;
        time_message = (newMessageTime > time_granted) ? newMessageTime : time_granted;
    } else {
        time_value = (newValueTime > time_next) ? newValueTime : time_next;
        time_message = (newMessageTime > time_next) ? newMessageTime : time_next;
    }

    time_exec = std::min({time_value, time_message, time_requested});
    if (info.uninterruptible) {
        if (time_exec > time_granted || iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = time_requested;
        }
    }
    dependencies.resetDependentEvents(time_granted);
    ++sequenceCounter;
    updateTimeFactors();

    if (!dependencies.empty()) {
        sendTimeRequest(GlobalFederateId{});
    }
}